

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::
TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
add_blocked_sample(TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *this,double t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Sample s;
  Sample local_50;
  
  paVar1 = &local_50.value.field_2;
  local_50.value._M_string_length = 0;
  local_50.value.field_2._M_local_buf[0] = '\0';
  local_50.blocked = true;
  local_50.t = t;
  local_50.value._M_dataplus._M_p = (pointer)paVar1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample>>
              *)this,&local_50);
  this->_dirty = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.value._M_dataplus._M_p,
                    CONCAT71(local_50.value.field_2._M_allocated_capacity._1_7_,
                             local_50.value.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }